

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utils.h
# Opt level: O0

void __thiscall
util::exception::exception<std::__cxx11::string&,char_const(&)[24]>
          (exception *this,basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *args,
          char (*args_1) [24])

{
  char (*in_RCX) [24];
  string local_40;
  char (*local_20) [24];
  char (*args_local_1) [24];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *args_local;
  exception *this_local;
  
  local_20 = args_1;
  args_local_1 = (char (*) [24])args;
  args_local = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this;
  make_string<std::__cxx11::string&,char_const(&)[24]>
            (&local_40,(util *)args,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)args_1,in_RCX);
  std::runtime_error::runtime_error(&this->super_runtime_error,(string *)&local_40);
  std::__cxx11::string::~string((string *)&local_40);
  *(undefined ***)this = &PTR__exception_00301e18;
  return;
}

Assistant:

explicit exception(Args&& ... args)
        : std::runtime_error(make_string(std::forward<Args>(args)...)) {}